

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

void If_ManImproveNodeUpdate(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vFront)

{
  int iVar1;
  uint uVar2;
  If_Cut_t *pCut_00;
  void *pvVar3;
  int local_34;
  int i;
  If_Obj_t *pFanin;
  If_Cut_t *pCut;
  Vec_Ptr_t *vFront_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  pCut_00 = If_ObjCutBest(pObj);
  If_CutAreaDeref(p,pCut_00);
  iVar1 = Vec_PtrSize(vFront);
  *(uint *)&pCut_00->field_0x1c = *(uint *)&pCut_00->field_0x1c & 0xffffff | iVar1 << 0x18;
  for (local_34 = 0; iVar1 = Vec_PtrSize(vFront), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(vFront,local_34);
    (&pCut_00[1].Area)[local_34] = *(float *)((long)pvVar3 + 4);
  }
  If_CutOrder(pCut_00);
  uVar2 = If_ObjCutSignCompute(pCut_00);
  pCut_00->uSign = uVar2;
  If_CutAreaRef(p,pCut_00);
  return;
}

Assistant:

void If_ManImproveNodeUpdate( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vFront )
{
    If_Cut_t * pCut;
    If_Obj_t * pFanin;
    int i;
    pCut = If_ObjCutBest(pObj);
    // deref node's cut
    If_CutAreaDeref( p, pCut );
    // update the node's cut
    pCut->nLeaves = Vec_PtrSize(vFront);
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
        pCut->pLeaves[i] = pFanin->Id;
    If_CutOrder( pCut );
    pCut->uSign = If_ObjCutSignCompute(pCut);
    // ref the new cut
    If_CutAreaRef( p, pCut );
}